

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

int Imf_3_4::getChunkOffsetTableSize(Header *header)

{
  bool bVar1;
  int *piVar2;
  ArgExc *this;
  Header *in_RDI;
  Header *in_stack_000000a0;
  string *in_stack_ffffffffffffffe0;
  int local_4;
  
  bVar1 = Header::hasType((Header *)0x206a83);
  if (bVar1) {
    Header::type_abi_cxx11_((Header *)0x206a96);
    bVar1 = isSupportedType(in_stack_ffffffffffffffe0);
    if (!bVar1) {
      bVar1 = Header::hasChunkCount((Header *)0x206aac);
      if (bVar1) {
        piVar2 = Header::chunkCount((Header *)0x206abc);
        return *piVar2;
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"unsupported header type to get chunk offset table size");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  Header::type_abi_cxx11_((Header *)0x206b23);
  bVar1 = isTiled(in_stack_ffffffffffffffe0);
  if (bVar1) {
    local_4 = getTiledChunkOffsetTableSize(in_stack_000000a0);
  }
  else {
    local_4 = getScanlineChunkOffsetTableSize(in_RDI);
  }
  return local_4;
}

Assistant:

int
getChunkOffsetTableSize (const Header& header)
{
    //
    // if there is a type in the header which indicates the part is not a currently supported type,
    // use the chunkCount attribute
    //

    if (header.hasType () && !isSupportedType (header.type ()))
    {
        if (header.hasChunkCount ()) { return header.chunkCount (); }
        else
        {
            throw IEX_NAMESPACE::ArgExc ("unsupported header type to "
                                         "get chunk offset table size");
        }
    }

    //
    // part is a known type - ignore the header attribute and compute the chunk size from the header
    //
    if (isTiled (header.type ()) == false)
        return getScanlineChunkOffsetTableSize (header);
    else
        return getTiledChunkOffsetTableSize (header);
}